

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_path.cpp
# Opt level: O3

void duckdb::ParsePathFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char cVar4;
  reference pvVar5;
  ulong uVar6;
  idx_t split_size;
  TemplatedValidityData<unsigned_long> *pTVar7;
  _Head_base<0UL,_unsigned_long_*,_false> _Var8;
  string_t *extraout_RDX;
  ulong uVar9;
  uint *puVar10;
  idx_t list_idx;
  idx_t idx_in_entry;
  ulong uVar11;
  char *input_data_00;
  SplitInput split_input;
  string input_sep;
  string sep;
  UnifiedVectorFormat input_data;
  undefined1 local_148 [16];
  ulong local_138;
  undefined8 local_128;
  char *local_120;
  undefined4 *local_118;
  string_t *local_110;
  undefined4 local_108 [4];
  Vector *local_f8;
  DataChunk *local_f0;
  Vector *local_e8;
  long local_e0;
  undefined8 local_d8;
  long local_d0;
  ulong local_c8;
  string local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  pvVar5 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar5,*(UnifiedVectorFormat **)(args + 0x18));
  local_d0 = local_70;
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"default","");
  if (*(long *)(args + 8) - *(long *)args == 0xd0) {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
    pvVar5 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar5,*(UnifiedVectorFormat **)(args + 0x18));
    if (((byte *)local_c0.field_2._M_allocated_capacity == (byte *)0x0) ||
       ((*(byte *)local_c0.field_2._M_allocated_capacity & 1) != 0)) {
      if ((ulong)*(uint *)local_c0._M_string_length < 0xd) {
        puVar10 = (uint *)(local_c0._M_string_length + 4);
      }
      else {
        puVar10 = *(uint **)(local_c0._M_string_length + 8);
      }
      local_148._0_8_ = (Vector *)&local_138;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,puVar10,
                 (ulong)*(uint *)local_c0._M_string_length + (long)puVar10);
      std::__cxx11::string::operator=((string *)&local_118,(string *)local_148);
      if ((Vector *)local_148._0_8_ != (Vector *)&local_138) {
        operator_delete((void *)local_148._0_8_);
      }
    }
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
    }
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
    }
  }
  local_148._0_4_ = SUB84(local_110,0);
  if ((uint)local_148._0_4_ < 0xd) {
    local_148._12_4_ = 0;
    local_148._4_4_ = 0;
    local_148._8_4_ = 0;
    if (local_148._0_4_ != 0) {
      memcpy(local_148 + 4,local_118,(ulong)(local_148._0_4_ & 0xf));
      local_110 = extraout_RDX;
    }
  }
  else {
    local_148._4_4_ = *local_118;
    local_148._8_4_ = SUB84(local_118,0);
    local_148._12_4_ = (undefined4)((ulong)local_118 >> 0x20);
  }
  GetSeparator_abi_cxx11_(&local_c0,(duckdb *)local_148,local_110);
  duckdb::Vector::SetVectorType((VectorType)result);
  duckdb::ListVector::SetListSize(result,0);
  local_e0 = *(long *)(result + 0x20);
  local_d8 = duckdb::ListVector::GetEntry(result);
  FlatVector::VerifyFlatVector(result);
  if (*(long *)(args + 0x18) == 0) {
    uVar9 = 0;
  }
  else {
    local_f8 = result + 0x30;
    uVar9 = 0;
    uVar11 = 0;
    local_f0 = args;
    local_e8 = result;
    do {
      uVar6 = uVar11;
      if (*local_78 != 0) {
        uVar6 = (ulong)*(uint *)(*local_78 + uVar11 * 4);
      }
      if ((local_68 == 0) || ((*(ulong *)(local_68 + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0))
      {
        local_148._0_4_ = SUB84(result,0);
        local_148._4_4_ = (undefined4)((ulong)result >> 0x20);
        local_148._8_4_ = (undefined4)local_d8;
        local_148._12_4_ = (undefined4)((ulong)local_d8 >> 0x20);
        local_128 = *(ulong *)(local_d0 + uVar6 * 0x10);
        local_120 = *(char **)(local_d0 + 8 + uVar6 * 0x10);
        local_138 = uVar9;
        local_c8 = uVar9;
        if ((uint)local_128 == 0) {
          list_idx = 0;
        }
        else {
          uVar9 = local_128 & 0xffffffff;
          input_data_00 = local_120;
          if ((uint)local_128 < 0xd) {
            input_data_00 = (char *)((long)&local_128 + 4);
          }
          list_idx = 0;
          do {
            split_size = Find(input_data_00,uVar9,&local_c0);
            if ((split_size == 0xffffffffffffffff) || (uVar9 < split_size)) {
              SplitInput::AddSplit((SplitInput *)local_148,input_data_00,uVar9,list_idx);
              list_idx = list_idx + 1;
              break;
            }
            if (split_size == 0) {
              if (list_idx == 0) {
                SplitInput::AddSplit((SplitInput *)local_148,input_data_00,1,0);
                list_idx = 1;
                if (uVar9 == 1) break;
              }
            }
            else {
              SplitInput::AddSplit((SplitInput *)local_148,input_data_00,split_size,list_idx);
              list_idx = list_idx + 1;
            }
            input_data_00 = input_data_00 + split_size + 1;
            uVar9 = uVar9 - (split_size + 1);
          } while (uVar9 != 0);
        }
        *(idx_t *)(local_e0 + 8 + uVar11 * 0x10) = list_idx;
        *(ulong *)(local_e0 + uVar11 * 0x10) = local_c8;
        uVar9 = local_c8 + list_idx;
        args = local_f0;
        result = local_e8;
      }
      else {
        _Var8._M_head_impl = *(unsigned_long **)(result + 0x28);
        if (_Var8._M_head_impl == (unsigned_long *)0x0) {
          local_128 = *(ulong *)(result + 0x40);
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_148,&local_128);
          uVar2 = CONCAT44(local_148._4_4_,local_148._0_4_);
          uVar3 = CONCAT44(local_148._12_4_,local_148._8_4_);
          local_148._0_4_ = 0;
          local_148._4_4_ = 0;
          local_148._8_4_ = 0;
          local_148._12_4_ = 0;
          this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = uVar2;
          *(undefined8 *)(result + 0x38) = uVar3;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT44(local_148._12_4_,local_148._8_4_) !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT44(local_148._12_4_,local_148._8_4_));
            }
          }
          pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                              local_f8);
          _Var8._M_head_impl =
               (pTVar7->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(unsigned_long **)(result + 0x28) = _Var8._M_head_impl;
        }
        bVar1 = (byte)uVar11 & 0x3f;
        _Var8._M_head_impl[uVar11 >> 6] =
             _Var8._M_head_impl[uVar11 >> 6] & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < *(ulong *)(args + 0x18));
  }
  duckdb::ListVector::SetListSize(result,uVar9);
  cVar4 = duckdb::DataChunk::AllConstant();
  if (cVar4 != '\0') {
    duckdb::Vector::SetVectorType((VectorType)result);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

static void ParsePathFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 1 || args.ColumnCount() == 2);
	UnifiedVectorFormat input_data;
	args.data[0].ToUnifiedFormat(args.size(), input_data);
	auto inputs = UnifiedVectorFormat::GetData<string_t>(input_data);

	// set the separator
	string input_sep = "default";
	if (args.ColumnCount() == 2) {
		UnifiedVectorFormat sep_data;
		args.data[1].ToUnifiedFormat(args.size(), sep_data);
		if (sep_data.validity.RowIsValid(0)) {
			input_sep = UnifiedVectorFormat::GetData<string_t>(sep_data)->GetString();
		}
	}
	const string sep = GetSeparator(input_sep);

	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);
	result.SetVectorType(VectorType::FLAT_VECTOR);
	ListVector::SetListSize(result, 0);

	// set up the list entries
	auto list_data = FlatVector::GetData<list_entry_t>(result);
	auto &child_entry = ListVector::GetEntry(result);
	auto &result_mask = FlatVector::Validity(result);
	idx_t total_splits = 0;
	for (idx_t i = 0; i < args.size(); i++) {
		auto input_idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(input_idx)) {
			result_mask.SetInvalid(i);
			continue;
		}
		SplitInput split_input(result, child_entry, total_splits);
		auto list_length = SplitPath(inputs[input_idx], sep, split_input);
		list_data[i].length = list_length;
		list_data[i].offset = total_splits;
		total_splits += list_length;
	}
	ListVector::SetListSize(result, total_splits);
	D_ASSERT(ListVector::GetListSize(result) == total_splits);

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}